

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_stl_vec_aarch64
               (TCGContext_conflict1 *tcg_ctx,TCGv_vec r,TCGv_ptr b,TCGArg o,TCGType low_type)

{
  TCGArg a;
  TCGArg a_00;
  TCGType type;
  TCGTemp *rt;
  TCGArg bi;
  TCGArg ri;
  TCGType low_type_local;
  TCGArg o_local;
  TCGv_ptr b_local;
  TCGv_vec r_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  a = tcgv_vec_arg(tcg_ctx,r);
  a_00 = tcgv_ptr_arg(tcg_ctx,b);
  arg_temp(a);
  vec_gen_3_aarch64(tcg_ctx,INDEX_op_st_vec,low_type,0,a,a_00,o);
  return;
}

Assistant:

void tcg_gen_stl_vec(TCGContext *tcg_ctx, TCGv_vec r, TCGv_ptr b, TCGArg o, TCGType low_type)
{
    TCGArg ri = tcgv_vec_arg(tcg_ctx, r);
    TCGArg bi = tcgv_ptr_arg(tcg_ctx, b);
    TCGTemp *rt = arg_temp(ri);
    TCGType type = rt->base_type;

    tcg_debug_assert(low_type >= TCG_TYPE_V64);
    tcg_debug_assert(low_type <= type);
    vec_gen_3(tcg_ctx, INDEX_op_st_vec, low_type, 0, ri, bi, o);
}